

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O3

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::
EncodeAttributesEncoderIdentifier
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *this,
          int32_t att_encoder_id)

{
  int iVar1;
  pointer pAVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined1 *puVar4;
  undefined1 *puVar5;
  undefined1 uVar6;
  pointer pcVar7;
  EncoderBuffer *pEVar8;
  int8_t att_data_id;
  byte local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  
  local_1c = *(byte *)((this->attribute_encoder_to_data_id_map_).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start + att_encoder_id);
  pEVar8 = (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_;
  if (pEVar8->bit_encoder_reserved_bytes_ < 1) {
    std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
              ((vector<char,std::allocator<char>> *)pEVar8,
               (pEVar8->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_1c,&local_1b);
  }
  if ((char)local_1c < '\0') {
    local_1b = (undefined1)this->pos_traversal_method_;
LAB_0013b982:
    pEVar8 = (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_;
    local_19 = 0;
    if (0 < pEVar8->bit_encoder_reserved_bytes_) goto LAB_0013b9a9;
    pcVar7 = (pEVar8->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar4 = &stack0xffffffffffffffe8;
    puVar5 = &local_19;
    uVar6 = local_1b;
  }
  else {
    iVar1 = (this->attribute_data_).
            super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
            ._M_impl.super__Vector_impl_data._M_start[local_1c].attribute_index;
    iVar3 = (*(this->super_MeshEdgebreakerEncoderImplInterface).
              _vptr_MeshEdgebreakerEncoderImplInterface[10])(this);
    iVar1 = *(int *)(*(long *)(*(long *)(CONCAT44(extraout_var,iVar3) + 0x70) + 0xa8) +
                    (long)iVar1 * 4);
    pAVar2 = (this->attribute_data_).
             super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1b = (undefined1)pAVar2[(char)local_1c].traversal_method;
    if ((iVar1 == 0) ||
       ((iVar1 == 1 && (pAVar2[(char)local_1c].connectivity_data.no_interior_seams_ == true))))
    goto LAB_0013b982;
    pEVar8 = (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_;
    local_1a = 1;
    if (0 < pEVar8->bit_encoder_reserved_bytes_) goto LAB_0013b9a9;
    pcVar7 = (pEVar8->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar4 = &local_19;
    puVar5 = &local_1a;
    uVar6 = local_1b;
  }
  std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
            ((vector<char,std::allocator<char>> *)pEVar8,pcVar7,puVar5,puVar4);
  local_1b = uVar6;
LAB_0013b9a9:
  pEVar8 = (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_;
  if (pEVar8->bit_encoder_reserved_bytes_ < 1) {
    std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
              ((vector<char,std::allocator<char>> *)pEVar8,
               (pEVar8->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_1b,&local_1a);
  }
  return true;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::
    EncodeAttributesEncoderIdentifier(int32_t att_encoder_id) {
  const int8_t att_data_id = attribute_encoder_to_data_id_map_[att_encoder_id];
  encoder_->buffer()->Encode(att_data_id);

  // Also encode the type of the encoder that we used.
  int32_t element_type = MESH_VERTEX_ATTRIBUTE;
  MeshTraversalMethod traversal_method;
  if (att_data_id >= 0) {
    const int32_t att_id = attribute_data_[att_data_id].attribute_index;
    element_type = GetEncoder()->mesh()->GetAttributeElementType(att_id);
    traversal_method = attribute_data_[att_data_id].traversal_method;
  } else {
    traversal_method = pos_traversal_method_;
  }
  if (element_type == MESH_VERTEX_ATTRIBUTE ||
      (element_type == MESH_CORNER_ATTRIBUTE &&
       attribute_data_[att_data_id].connectivity_data.no_interior_seams())) {
    // Per-vertex encoder.
    encoder_->buffer()->Encode(static_cast<uint8_t>(MESH_VERTEX_ATTRIBUTE));
  } else {
    // Per-corner encoder.
    encoder_->buffer()->Encode(static_cast<uint8_t>(MESH_CORNER_ATTRIBUTE));
  }
  // Encode the mesh traversal method.
  encoder_->buffer()->Encode(static_cast<uint8_t>(traversal_method));
  return true;
}